

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workWithFilesAndCiphertext.h
# Opt level: O3

string * getBits_abi_cxx11_(string *__return_storage_ptr__,
                           vector<unsigned_int,_std::allocator<unsigned_int>_> *arr)

{
  uint *puVar1;
  uint *puVar2;
  bitset<32UL> bits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  ulong local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar2 = (arr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (arr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      local_38 = (ulong)*puVar2;
      std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
                (&local_58,(bitset<32ul> *)&local_38);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getBits(const std::vector<unsigned> &arr) {
    std::string arrBits;
    for (const auto dword : arr) {
        std::bitset<32> bits(dword);
        arrBits += bits.to_string();
    }

    return arrBits;
}